

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO2Quad<double> *this,
          MatrixXd *refcoords)

{
  Index IVar1;
  CoeffReturnType piVar2;
  RowXpr local_560;
  RowXpr local_528;
  RowXpr local_4f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_4b8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_440;
  int local_3c8;
  int i;
  MatrixXd local_388;
  Matrix<double,__1,__1,_0,__1,__1> local_370;
  NestedExpressionType local_358;
  undefined1 local_350 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x1_eval;
  ConstRowXpr local_330;
  MatrixXd local_2f8;
  Matrix<double,__1,__1,_0,__1,__1> local_2e0;
  NestedExpressionType local_2c8;
  undefined1 local_2c0 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x0_eval;
  uint local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeLagrangeO2Quad<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeLagrangeO2Quad<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Reference coordinates must be 2-vectors");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"refcoords.rows() == 2",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x30e,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x30e,(string *)&n_pts);
    std::__cxx11::string::~string((string *)&n_pts);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_2a0 = (uint)IVar1;
  segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
  _7_1_ = 0;
  segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
  _0_4_ = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (int *)&segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_cols,&local_2a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_330,local_20,0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2f8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_330);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            (&local_2e0,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_2f8);
  local_2c8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2e0);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_2c0,&local_2c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row((ConstRowXpr *)&i,local_20,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_388,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&i);
  FeLagrangeO2Segment<double>::EvalReferenceShapeFunctions
            (&local_370,(FeLagrangeO2Segment<double> *)&krsf_segment_,&local_388);
  local_358 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_370);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_350,&local_358);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_370);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_388);
  for (local_3c8 = 0; local_3c8 < 9; local_3c8 = local_3c8 + 1) {
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_3c8,0);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_4f0,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_2c0,
               (long)*piVar2);
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_9,_2,_0,_9,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_3c8,1);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_528,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_350,
               (long)*piVar2);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
              (&local_4b8,
               (ArrayBase<Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>> *)&local_4f0,
               (ArrayBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_528);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::matrix(&local_440,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_4b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_560,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               (long)local_3c8);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_560,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                *)&local_440);
  }
  segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
  _7_1_ = 1;
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_350);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_2c0);
  if ((segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_cols._7_1_ & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    // Number of evaluation points
    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(9, n_pts);

    // evaluate "segment" shape functions (b^j and b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(0))).array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(1))).array();

    // Evaluate basis functions using the tensor product structure
    for (int i = 0; i < 9; ++i) {
      result.row(i) = (segment_x0_eval.row(ksegment_to_quad_mapping_(i, 0)) *
                       segment_x1_eval.row(ksegment_to_quad_mapping_(i, 1)))
                          .matrix();
    }
    return result;
  }